

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O0

int __thiscall
TPZSkylMatrix<std::complex<float>_>::Subst_LForward
          (TPZSkylMatrix<std::complex<float>_> *this,TPZFMatrix<std::complex<float>_> *B)

{
  complex<float> *pcVar1;
  complex<float> *__z;
  complex<float> *pcVar2;
  int64_t iVar3;
  complex<float> **ppcVar4;
  TPZFMatrix<std::complex<float>_> *this_00;
  TPZBaseMatrix *in_RSI;
  long *in_RDI;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  complex<float> *BPtr;
  complex<float> *end_ki;
  complex<float> *elem_ki;
  complex<float> sum;
  int64_t j;
  int64_t k;
  int64_t dimension;
  complex<float> *in_stack_ffffffffffffffa0;
  int64_t in_stack_ffffffffffffffa8;
  TPZFMatrix<std::complex<float>_> *in_stack_ffffffffffffffb0;
  complex<float> *local_40;
  complex<float> local_38;
  complex<float> *local_30;
  long local_28;
  long local_20;
  TPZBaseMatrix *local_18;
  int local_4;
  
  local_18 = in_RSI;
  __z = (complex<float> *)TPZBaseMatrix::Rows(in_RSI);
  pcVar2 = (complex<float> *)(**(code **)(*in_RDI + 0x60))();
  if ((__z == pcVar2) && (((char)in_RDI[3] == '\x04' || ((char)in_RDI[3] == '\x01')))) {
    local_20 = (**(code **)(*in_RDI + 0x60))();
    for (local_28 = 0; local_28 < local_20; local_28 = local_28 + 1) {
      local_30 = (complex<float> *)0x0;
      while( true ) {
        pcVar2 = local_30;
        iVar3 = TPZBaseMatrix::Cols(local_18);
        if (iVar3 <= (long)pcVar2) break;
        std::complex<float>::complex(&local_38,0.0,0.0);
        ppcVar4 = TPZVec<std::complex<float>_*>::operator[]
                            ((TPZVec<std::complex<float>_*> *)(in_RDI + 4),local_28);
        local_40 = *ppcVar4;
        ppcVar4 = TPZVec<std::complex<float>_*>::operator[]
                            ((TPZVec<std::complex<float>_*> *)(in_RDI + 4),local_28 + 1);
        pcVar1 = *ppcVar4;
        this_00 = (TPZFMatrix<std::complex<float>_> *)
                  TPZFMatrix<std::complex<float>_>::operator()
                            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                             (int64_t)in_stack_ffffffffffffffa0);
        while (local_40 = local_40 + 1, local_40 < pcVar1) {
          std::conj<float>(pcVar2);
          in_stack_ffffffffffffffa0 = (complex<float> *)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
          this_00 = (TPZFMatrix<std::complex<float>_> *)&this_00[-1].fWork.fNAlloc;
          std::operator*(pcVar2,(complex<float> *)0x1370124);
          in_stack_ffffffffffffffa8 = CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
          std::complex<float>::operator+=(in_stack_ffffffffffffffa0,__z);
        }
        in_stack_ffffffffffffffb0 =
             (TPZFMatrix<std::complex<float>_> *)
             TPZFMatrix<std::complex<float>_>::operator()
                       (this_00,in_stack_ffffffffffffffa8,(int64_t)in_stack_ffffffffffffffa0);
        std::complex<float>::operator-=(in_stack_ffffffffffffffa0,__z);
        local_30 = (complex<float> *)((long)&local_30->_M_value + 1);
      }
    }
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int
TPZSkylMatrix<TVar>::Subst_LForward( TPZFMatrix<TVar> *B ) const {
    if ( (B->Rows() != this->Dim()) || (this->fDecomposed != ELDLt && this->fDecomposed != ELU) )
        return( 0 );
    
    int64_t dimension =this->Dim();
    for ( int64_t k = 0; k < dimension; k++ ) {
        for ( int64_t j = 0; j < B->Cols(); j++ ) {
            // Faz sum = SOMA( A[k,i] * B[i,j] ), para i = 1, ..., k-1.
            //
            TVar sum = 0.0;
            TVar *elem_ki = fElem[k]+1;
            TVar *end_ki  = fElem[k+1];
            TVar *BPtr = &(*B)(k,j);
            if constexpr(is_complex<TVar>::value)
                while(elem_ki < end_ki) sum += std::conj(*elem_ki++) * (*--BPtr);//(*BPtr--)
            else
                while(elem_ki < end_ki) sum += (*elem_ki++) * (*--BPtr);//(*BPtr--)
            
            // Faz B[k,j] = (B[k,j] - sum) / A[k,k].
            //
            //	B->PutVal( k, j, (B->GetVal(k, j) - sum) / row_k->pElem[0] );
            BPtr = &(*B)(k,j);
            *BPtr-= sum;
        }
    }
    return( 1 );
}